

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yield_token_conversion.cpp
# Opt level: O1

int main(void)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  undefined8 uVar3;
  error_category *peVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  stack_context *psVar8;
  service *psVar9;
  stack_context sVar10;
  io_context io;
  fiber tmp;
  fiber local_88;
  int local_7c;
  io_context local_78;
  error_code local_68;
  undefined **local_58 [2];
  fcontext_t local_48;
  error_category *local_40;
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_7c = 0;
  boost::asio::io_context::io_context(&local_78);
  local_58[0] = (undefined **)boost::context::stack_traits::default_size();
  sVar10 = boost::context::basic_fixedsize_stack<boost::context::stack_traits>::allocate
                     ((basic_fixedsize_stack<boost::context::stack_traits> *)local_58);
  psVar8 = (stack_context *)((long)sVar10.sp - 0x30U & 0xffffffffffffff00);
  *psVar8 = sVar10;
  psVar8[1].size = (size_t)local_58[0];
  psVar8[1].sp = &local_7c;
  psVar8[2].size = (size_t)&local_78;
  *(undefined4 *)((long)&psVar8[2].sp + 4) = 0;
  lVar6 = make_fcontext(psVar8 + -4,(long)psVar8 + (sVar10.size - (long)sVar10.sp) + -0x40,
                        boost::context::detail::
                        fiber_entry<boost::context::detail::fiber_record<boost::context::fiber,boost::context::basic_fixedsize_stack<boost::context::stack_traits>,ufiber::detail::fiber_main<main::__0,boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,ufiber::broken_promise>>>
                       );
  if (lVar6 == 0) {
    __assert_fail("nullptr != fctx","/usr/include/boost/context/fiber_fcontext.hpp",0xac,
                  "fcontext_t boost::context::detail::create_fiber1(StackAlloc &&, Fn &&) [Record = boost::context::detail::fiber_record<boost::context::fiber, boost::context::basic_fixedsize_stack<boost::context::stack_traits>, ufiber::detail::fiber_main<(lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp:23:7), boost::asio::io_context::basic_executor_type<std::allocator<void>, 0>>>, StackAlloc = boost::context::basic_fixedsize_stack<boost::context::stack_traits>, Fn = ufiber::detail::fiber_main<(lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp:23:7), boost::asio::io_context::basic_executor_type<std::allocator<void>, 0>>]"
                 );
  }
  local_88.fctx_ = (fcontext_t)jump_fcontext(lVar6,psVar8);
  boost::context::fiber::resume((fiber *)&local_68);
  uVar3 = local_68._0_8_;
  local_58[0] = (undefined **)local_88.fctx_;
  local_68._0_8_ = (fcontext_t)0x0;
  local_88.fctx_ = (fcontext_t)uVar3;
  boost::context::fiber::~fiber((fiber *)local_58);
  boost::context::fiber::~fiber((fiber *)&local_68);
  if (local_88.fctx_ != (fcontext_t)0x0) {
    __assert_fail("!f && \"Unexpected fiber\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/include/ufiber/impl/ufiber.ipp"
                  ,0x42,"void ufiber::detail::initial_resume(boost::context::fiber &&)");
  }
  boost::context::fiber::~fiber(&local_88);
  local_68._0_8_ = local_68._0_8_ & 0xffffff0000000000;
  local_68.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  sVar7 = boost::asio::detail::scheduler::run(local_78.impl_,&local_68);
  peVar4 = local_68.cat_;
  uVar3 = local_68._0_8_;
  if (local_68.failed_ == true) {
    std::runtime_error::runtime_error((runtime_error *)local_58,"");
    local_38._M_p = (pointer)&(((system_error *)local_58)->m_what).field_2;
    local_58[0] = &PTR__system_error_0010e640;
    local_48 = (fcontext_t)uVar3;
    local_40 = peVar4;
    local_30 = 0;
    local_28._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_58);
  }
  boost::detail::test_impl
            ("io.run() > 0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp"
             ,0x29,"int main()",sVar7 != 0);
  boost::detail::test_impl
            ("count == 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp"
             ,0x2a,"int main()",local_7c == 3);
  iVar5 = boost::report_errors();
  for (psVar9 = (local_78.super_execution_context.service_registry_)->first_service_;
      eVar2.service_registry_ = local_78.super_execution_context.service_registry_,
      psVar9 != (service *)0x0; psVar9 = psVar9->next_) {
    (*psVar9->_vptr_service[2])(psVar9);
  }
  psVar9 = (local_78.super_execution_context.service_registry_)->first_service_;
  while (psVar9 != (service *)0x0) {
    ppp_Var1 = &psVar9->_vptr_service;
    psVar9 = psVar9->next_;
    (*(*ppp_Var1)[1])();
    (eVar2.service_registry_)->first_service_ = psVar9;
  }
  if (local_78.super_execution_context.service_registry_ != (service_registry *)0x0) {
    pthread_mutex_destroy
              ((pthread_mutex_t *)&(local_78.super_execution_context.service_registry_)->mutex_);
    operator_delete(local_78.super_execution_context.service_registry_,0x40);
  }
  return iVar5;
}

Assistant:

int
main()
{
    // Check if it's possible to do yield_token conversions (e.g. to type erase
    // the executor)
    int count = 0;
    auto f =
      [&](ufiber::yield_token<boost::asio::io_context::executor_type> y) {
          ++count;
          ufiber::yield_token<boost::asio::io_context::executor_type> yield{y};
          // Check we don't get spawned into the system executor by accident
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          boost::asio::post(yield);
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          ++count;
          ufiber::yield_token<boost::asio::executor> yield2{y};
          boost::asio::post(yield2);
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          ++count;
      };

    count = 0;
    boost::asio::io_context io{};
    ufiber::spawn(io, f);

    BOOST_TEST(io.run() > 0);
    BOOST_TEST(count == 3);

    return boost::report_errors();
}